

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
          (basisu_lowlevel_etc1s_transcoder *this,uint32_t num_endpoints,uint8_t *pEndpoints_data,
          uint32_t endpoints_data_size,uint32_t num_selectors,uint8_t *pSelectors_data,
          uint32_t selectors_data_size)

{
  uint8_t uVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  uint32_t uVar5;
  endpoint *peVar6;
  byte *pbVar7;
  uint8_t *puVar8;
  selector *this_00;
  EVP_PKEY_CTX *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint in_R8D;
  EVP_PKEY_CTX *in_R9;
  uint32_t k_2;
  uint32_t cur_byte_2;
  int delta_byte;
  uint32_t j_2;
  uint32_t k_1;
  uint32_t cur_byte_1;
  uint32_t j_1;
  uint32_t i_2;
  uint8_t prev_bytes [4];
  uint32_t k;
  uint32_t cur_byte;
  uint32_t j;
  uint32_t i_1;
  bool used_raw_encoding;
  bool used_hybrid_selector_cb;
  bool used_global_selector_cb;
  huffman_decoding_table delta_selector_pal_model;
  int v;
  int delta;
  uint32_t c;
  uint32_t inten_delta;
  uint32_t i;
  uint32_t prev_inten;
  color32 prev_color5;
  bool endpoints_are_grayscale;
  huffman_decoding_table inten_delta_model;
  huffman_decoding_table color5_delta_model2;
  huffman_decoding_table color5_delta_model1;
  huffman_decoding_table color5_delta_model0;
  bitwise_decoder sym_codec;
  selector *in_stack_fffffffffffffd18;
  huffman_decoding_table *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  uint32_t in_stack_fffffffffffffd2c;
  vector<basist::selector> *in_stack_fffffffffffffd30;
  int fast_lookup_bits;
  huffman_decoding_table *in_stack_fffffffffffffd38;
  uint32_t in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd44;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  selector *in_stack_fffffffffffffd48;
  selector *in_stack_fffffffffffffd50;
  huffman_decoding_table *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  byte in_stack_fffffffffffffe1f;
  uint local_1b8;
  uint local_1ac;
  uint local_1a8;
  uint local_1a0;
  uint local_19c;
  byte local_198 [4];
  uint local_194;
  uint32_t local_190;
  uint local_18c;
  uint local_188;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  uint local_14c;
  uint32_t local_148;
  uint local_144;
  uint32_t local_140;
  uint local_13c;
  uint local_138;
  byte local_12d;
  undefined4 local_12c;
  bitwise_decoder local_58;
  EVP_PKEY_CTX *local_30;
  uint local_28;
  EVP_PKEY_CTX *local_20;
  uint local_14;
  byte local_1;
  
  if (*in_RDI != 0) {
    local_1 = 0;
    goto LAB_00198747;
  }
  local_30 = in_R9;
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_14 = in_ESI;
  bitwise_decoder::bitwise_decoder(&local_58);
  huffman_decoding_table::huffman_decoding_table
            ((huffman_decoding_table *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,
                               CONCAT24(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))));
  huffman_decoding_table::huffman_decoding_table
            ((huffman_decoding_table *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,
                               CONCAT24(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))));
  huffman_decoding_table::huffman_decoding_table
            ((huffman_decoding_table *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,
                               CONCAT24(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))));
  huffman_decoding_table::huffman_decoding_table
            ((huffman_decoding_table *)
             CONCAT17(in_stack_fffffffffffffd47,
                      CONCAT16(in_stack_fffffffffffffd46,
                               CONCAT24(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40))));
  uVar4 = bitwise_decoder::init(&local_58,local_20);
  if ((uVar4 & 1) == 0) {
    local_1 = 0;
    local_12c = 1;
  }
  else {
    bVar2 = bitwise_decoder::read_huffman_table
                      ((bitwise_decoder *)
                       CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                       in_stack_fffffffffffffe10);
    if (bVar2) {
      bVar2 = bitwise_decoder::read_huffman_table
                        ((bitwise_decoder *)
                         CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe10);
      if (bVar2) {
        bVar2 = bitwise_decoder::read_huffman_table
                          ((bitwise_decoder *)
                           CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                           in_stack_fffffffffffffe10);
        if (bVar2) {
          bVar2 = bitwise_decoder::read_huffman_table
                            ((bitwise_decoder *)
                             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                             in_stack_fffffffffffffe10);
          if (bVar2) {
            bVar2 = huffman_decoding_table::is_valid((huffman_decoding_table *)0x197b9d);
            if ((((bVar2) &&
                 (bVar2 = huffman_decoding_table::is_valid((huffman_decoding_table *)0x197bc0),
                 bVar2)) &&
                (bVar2 = huffman_decoding_table::is_valid((huffman_decoding_table *)0x197be3), bVar2
                )) && (bVar2 = huffman_decoding_table::is_valid((huffman_decoding_table *)0x197c06),
                      bVar2)) {
              uVar5 = bitwise_decoder::get_bits
                                ((bitwise_decoder *)
                                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                 (uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20));
              local_12d = uVar5 != 0;
              basisu::vector<basist::endpoint>::resize
                        ((vector<basist::endpoint> *)in_stack_fffffffffffffd30,
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         SUB81((ulong)in_stack_fffffffffffffd20 >> 0x38,0));
              color32::color32((color32 *)in_stack_fffffffffffffd20,
                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffd18,0,0x197c97);
              local_138 = 0;
              for (local_13c = 0; local_13c < local_14; local_13c = local_13c + 1) {
                local_140 = bitwise_decoder::decode_huffman
                                      ((bitwise_decoder *)
                                       CONCAT17(in_stack_fffffffffffffd47,
                                                CONCAT16(in_stack_fffffffffffffd46,
                                                         CONCAT24(in_stack_fffffffffffffd44,
                                                                  in_stack_fffffffffffffd40))),
                                       in_stack_fffffffffffffd38,
                                       (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
                in_stack_fffffffffffffe1f = (char)local_140 + (char)local_138 & 7;
                peVar6 = basisu::vector<basist::endpoint>::operator[]
                                   ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                                    (size_t)in_stack_fffffffffffffd18);
                peVar6->m_inten5 = in_stack_fffffffffffffe1f;
                in_stack_fffffffffffffe10 =
                     (huffman_decoding_table *)
                     basisu::vector<basist::endpoint>::operator[]
                               ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                                (size_t)in_stack_fffffffffffffd18);
                local_138 = (uint)((anon_union_4_3_898e29d3_for_color32_0 *)
                                  &(in_stack_fffffffffffffe10->m_code_sizes).m_p)[1].field_0.r;
                local_144 = 0;
                while( true ) {
                  uVar4 = 3;
                  if ((local_12d & 1) != 0) {
                    uVar4 = 1;
                  }
                  if (uVar4 <= local_144) break;
                  pbVar7 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  if (*pbVar7 < 10) {
                    local_148 = bitwise_decoder::decode_huffman
                                          ((bitwise_decoder *)
                                           CONCAT17(in_stack_fffffffffffffd47,
                                                    CONCAT16(in_stack_fffffffffffffd46,
                                                             CONCAT24(in_stack_fffffffffffffd44,
                                                                      in_stack_fffffffffffffd40))),
                                           in_stack_fffffffffffffd38,
                                           (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
                  }
                  else {
                    pbVar7 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                                 (uint32_t)
                                                 ((ulong)in_stack_fffffffffffffd18 >> 0x20));
                    fast_lookup_bits = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
                    if (*pbVar7 < 0x16) {
                      local_148 = bitwise_decoder::decode_huffman
                                            ((bitwise_decoder *)
                                             CONCAT17(in_stack_fffffffffffffd47,
                                                      CONCAT16(in_stack_fffffffffffffd46,
                                                               CONCAT24(in_stack_fffffffffffffd44,
                                                                        in_stack_fffffffffffffd40)))
                                             ,in_stack_fffffffffffffd38,fast_lookup_bits);
                    }
                    else {
                      local_148 = bitwise_decoder::decode_huffman
                                            ((bitwise_decoder *)
                                             CONCAT17(in_stack_fffffffffffffd47,
                                                      CONCAT16(in_stack_fffffffffffffd46,
                                                               CONCAT24(in_stack_fffffffffffffd44,
                                                                        in_stack_fffffffffffffd40)))
                                             ,in_stack_fffffffffffffd38,fast_lookup_bits);
                    }
                  }
                  pbVar7 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  local_14c = *pbVar7 + local_148 & 0x1f;
                  uVar1 = (uint8_t)local_14c;
                  basisu::vector<basist::endpoint>::operator[]
                            ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                             (size_t)in_stack_fffffffffffffd18);
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  *puVar8 = uVar1;
                  uVar1 = (uint8_t)local_14c;
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  *puVar8 = uVar1;
                  local_144 = local_144 + 1;
                }
                if ((local_12d & 1) != 0) {
                  basisu::vector<basist::endpoint>::operator[]
                            ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                             (size_t)in_stack_fffffffffffffd18);
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  uVar1 = *puVar8;
                  basisu::vector<basist::endpoint>::operator[]
                            ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                             (size_t)in_stack_fffffffffffffd18);
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  *puVar8 = uVar1;
                  basisu::vector<basist::endpoint>::operator[]
                            ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                             (size_t)in_stack_fffffffffffffd18);
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  uVar1 = *puVar8;
                  basisu::vector<basist::endpoint>::operator[]
                            ((vector<basist::endpoint> *)in_stack_fffffffffffffd20,
                             (size_t)in_stack_fffffffffffffd18);
                  puVar8 = color32::operator[]((color32 *)in_stack_fffffffffffffd20,
                                               (uint32_t)((ulong)in_stack_fffffffffffffd18 >> 0x20))
                  ;
                  *puVar8 = uVar1;
                }
              }
              bitwise_decoder::stop(&local_58);
              basisu::vector<basist::selector>::resize
                        (in_stack_fffffffffffffd30,
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         SUB81((ulong)in_stack_fffffffffffffd20 >> 0x38,0));
              uVar4 = bitwise_decoder::init(&local_58,local_30);
              if ((uVar4 & 1) == 0) {
                local_1 = 0;
                local_12c = 1;
              }
              else {
                huffman_decoding_table::huffman_decoding_table
                          ((huffman_decoding_table *)
                           CONCAT17(in_stack_fffffffffffffd47,
                                    CONCAT16(in_stack_fffffffffffffd46,
                                             CONCAT24(in_stack_fffffffffffffd44,
                                                      in_stack_fffffffffffffd40))));
                uVar5 = bitwise_decoder::get_bits
                                  ((bitwise_decoder *)
                                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                   (uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20));
                local_181 = uVar5 == 1;
                if ((bool)local_181) {
                  local_1 = 0;
                }
                else {
                  uVar5 = bitwise_decoder::get_bits
                                    ((bitwise_decoder *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                     (uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20));
                  local_182 = uVar5 == 1;
                  if ((bool)local_182) {
                    local_1 = 0;
                  }
                  else {
                    uVar5 = bitwise_decoder::get_bits
                                      ((bitwise_decoder *)
                                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                                       ,(uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20));
                    local_183 = uVar5 == 1;
                    if ((bool)local_183) {
                      for (local_188 = 0; local_188 < local_28; local_188 = local_188 + 1) {
                        for (local_18c = 0; local_18c < 4; local_18c = local_18c + 1) {
                          local_190 = bitwise_decoder::get_bits
                                                ((bitwise_decoder *)
                                                 CONCAT44(in_stack_fffffffffffffd2c,
                                                          in_stack_fffffffffffffd28),
                                                 (uint32_t)
                                                 ((ulong)in_stack_fffffffffffffd20 >> 0x20));
                          for (local_194 = 0; local_194 < 4; local_194 = local_194 + 1) {
                            this_00 = basisu::vector<basist::selector>::operator[]
                                                ((vector<basist::selector> *)
                                                 in_stack_fffffffffffffd20,
                                                 (size_t)in_stack_fffffffffffffd18);
                            selector::set_selector
                                      (this_00,(uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                                       (uint32_t)in_stack_fffffffffffffd48,
                                       CONCAT13(in_stack_fffffffffffffd47,
                                                CONCAT12(in_stack_fffffffffffffd46,
                                                         in_stack_fffffffffffffd44)));
                          }
                        }
                        in_stack_fffffffffffffd48 =
                             basisu::vector<basist::selector>::operator[]
                                       ((vector<basist::selector> *)in_stack_fffffffffffffd20,
                                        (size_t)in_stack_fffffffffffffd18);
                        selector::init_flags
                                  ((selector *)
                                   CONCAT17(in_stack_fffffffffffffd47,
                                            CONCAT16(in_stack_fffffffffffffd46,
                                                     CONCAT24(in_stack_fffffffffffffd44,
                                                              in_stack_fffffffffffffd40))));
                      }
LAB_001986aa:
                      bitwise_decoder::stop(&local_58);
                      local_1 = 1;
                    }
                    else {
                      uVar3 = bitwise_decoder::read_huffman_table
                                        ((bitwise_decoder *)
                                         CONCAT17(in_stack_fffffffffffffe1f,
                                                  in_stack_fffffffffffffe18),
                                         in_stack_fffffffffffffe10);
                      if ((bool)uVar3) {
                        if ((local_28 < 2) ||
                           (in_stack_fffffffffffffd46 =
                                 huffman_decoding_table::is_valid
                                           ((huffman_decoding_table *)0x1983dd),
                           (bool)in_stack_fffffffffffffd46)) {
                          memset(local_198,0,4);
                          for (local_19c = 0; local_19c < local_28; local_19c = local_19c + 1) {
                            if (local_19c == 0) {
                              for (local_1a0 = 0; local_1a0 < 4; local_1a0 = local_1a0 + 1) {
                                in_stack_fffffffffffffd40 =
                                     bitwise_decoder::get_bits
                                               ((bitwise_decoder *)
                                                CONCAT44(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28),
                                                (uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20)
                                               );
                                local_198[local_1a0] = (byte)in_stack_fffffffffffffd40;
                                for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
                                  in_stack_fffffffffffffd38 =
                                       (huffman_decoding_table *)
                                       basisu::vector<basist::selector>::operator[]
                                                 ((vector<basist::selector> *)
                                                  in_stack_fffffffffffffd20,
                                                  (size_t)in_stack_fffffffffffffd18);
                                  selector::set_selector
                                            (in_stack_fffffffffffffd50,
                                             (uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                                             (uint32_t)in_stack_fffffffffffffd48,
                                             CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd46,
                                                                     in_stack_fffffffffffffd44)));
                                }
                              }
                              in_stack_fffffffffffffd30 =
                                   (vector<basist::selector> *)
                                   basisu::vector<basist::selector>::operator[]
                                             ((vector<basist::selector> *)in_stack_fffffffffffffd20,
                                              (size_t)in_stack_fffffffffffffd18);
                              selector::init_flags
                                        ((selector *)
                                         CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffd46,
                                                                 CONCAT24(in_stack_fffffffffffffd44,
                                                                          in_stack_fffffffffffffd40)
                                                                )));
                            }
                            else {
                              for (local_1ac = 0; local_1ac < 4; local_1ac = local_1ac + 1) {
                                in_stack_fffffffffffffd2c =
                                     bitwise_decoder::decode_huffman
                                               ((bitwise_decoder *)
                                                CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffd46,
                                                                        CONCAT24(
                                                  in_stack_fffffffffffffd44,
                                                  in_stack_fffffffffffffd40))),
                                                in_stack_fffffffffffffd38,
                                                (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
                                local_198[local_1ac] =
                                     (byte)in_stack_fffffffffffffd2c ^ local_198[local_1ac];
                                for (local_1b8 = 0; local_1b8 < 4; local_1b8 = local_1b8 + 1) {
                                  in_stack_fffffffffffffd20 =
                                       (huffman_decoding_table *)
                                       basisu::vector<basist::selector>::operator[]
                                                 ((vector<basist::selector> *)
                                                  in_stack_fffffffffffffd20,
                                                  (size_t)in_stack_fffffffffffffd18);
                                  selector::set_selector
                                            (in_stack_fffffffffffffd50,
                                             (uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                                             (uint32_t)in_stack_fffffffffffffd48,
                                             CONCAT13(uVar3,CONCAT12(in_stack_fffffffffffffd46,
                                                                     in_stack_fffffffffffffd44)));
                                }
                              }
                              in_stack_fffffffffffffd18 =
                                   basisu::vector<basist::selector>::operator[]
                                             ((vector<basist::selector> *)in_stack_fffffffffffffd20,
                                              (size_t)in_stack_fffffffffffffd18);
                              selector::init_flags
                                        ((selector *)
                                         CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffd46,
                                                                 CONCAT24(in_stack_fffffffffffffd44,
                                                                          in_stack_fffffffffffffd40)
                                                                )));
                            }
                          }
                          goto LAB_001986aa;
                        }
                        local_1 = 0;
                      }
                      else {
                        local_1 = 0;
                      }
                    }
                  }
                }
                local_12c = 1;
                huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffd20);
              }
            }
            else {
              local_1 = 0;
              local_12c = 1;
            }
          }
          else {
            local_1 = 0;
            local_12c = 1;
          }
        }
        else {
          local_1 = 0;
          local_12c = 1;
        }
      }
      else {
        local_1 = 0;
        local_12c = 1;
      }
    }
    else {
      local_1 = 0;
      local_12c = 1;
    }
  }
  huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffd20);
  huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffd20);
  huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffd20);
  huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffd20);
LAB_00198747:
  return (bool)(local_1 & 1);
}

Assistant:

bool basisu_lowlevel_etc1s_transcoder::decode_palettes(
		uint32_t num_endpoints, const uint8_t* pEndpoints_data, uint32_t endpoints_data_size,
		uint32_t num_selectors, const uint8_t* pSelectors_data, uint32_t selectors_data_size)
	{
		if (m_pGlobal_codebook)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 11\n");
			return false;
		}
		bitwise_decoder sym_codec;

		huffman_decoding_table color5_delta_model0, color5_delta_model1, color5_delta_model2, inten_delta_model;

		if (!sym_codec.init(pEndpoints_data, endpoints_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 0\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model0))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model1))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model2))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(inten_delta_model))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		if (!color5_delta_model0.is_valid() || !color5_delta_model1.is_valid() || !color5_delta_model2.is_valid() || !inten_delta_model.is_valid())
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		const bool endpoints_are_grayscale = sym_codec.get_bits(1) != 0;

		m_local_endpoints.resize(num_endpoints);

		color32 prev_color5(16, 16, 16, 0);
		uint32_t prev_inten = 0;

		for (uint32_t i = 0; i < num_endpoints; i++)
		{
			uint32_t inten_delta = sym_codec.decode_huffman(inten_delta_model);
			m_local_endpoints[i].m_inten5 = static_cast<uint8_t>((inten_delta + prev_inten) & 7);
			prev_inten = m_local_endpoints[i].m_inten5;

			for (uint32_t c = 0; c < (endpoints_are_grayscale ? 1U : 3U); c++)
			{
				int delta;
				if (prev_color5[c] <= basist::COLOR5_PAL0_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model0);
				else if (prev_color5[c] <= basist::COLOR5_PAL1_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model1);
				else
					delta = sym_codec.decode_huffman(color5_delta_model2);

				int v = (prev_color5[c] + delta) & 31;

				m_local_endpoints[i].m_color5[c] = static_cast<uint8_t>(v);

				prev_color5[c] = static_cast<uint8_t>(v);
			}

			if (endpoints_are_grayscale)
			{
				m_local_endpoints[i].m_color5[1] = m_local_endpoints[i].m_color5[0];
				m_local_endpoints[i].m_color5[2] = m_local_endpoints[i].m_color5[0];
			}
		}

		sym_codec.stop();

		m_local_selectors.resize(num_selectors);
		
		if (!sym_codec.init(pSelectors_data, selectors_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 5\n");
			return false;
		}

		basist::huffman_decoding_table delta_selector_pal_model;

		const bool used_global_selector_cb = (sym_codec.get_bits(1) == 1);

		if (used_global_selector_cb)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: global selector codebooks are unsupported\n");
			return false;
		}
		else
		{
			const bool used_hybrid_selector_cb = (sym_codec.get_bits(1) == 1);

			if (used_hybrid_selector_cb)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: hybrid global selector codebooks are unsupported\n");
				return false;
			}
				
			const bool used_raw_encoding = (sym_codec.get_bits(1) == 1);

			if (used_raw_encoding)
			{
				for (uint32_t i = 0; i < num_selectors; i++)
				{
					for (uint32_t j = 0; j < 4; j++)
					{
						uint32_t cur_byte = sym_codec.get_bits(8);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}

					m_local_selectors[i].init_flags();
				}
			}
			else
			{
				if (!sym_codec.read_huffman_table(delta_selector_pal_model))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10\n");
					return false;
				}

				if ((num_selectors > 1) && (!delta_selector_pal_model.is_valid()))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10a\n");
					return false;
				}

				uint8_t prev_bytes[4] = { 0, 0, 0, 0 };

				for (uint32_t i = 0; i < num_selectors; i++)
				{
					if (!i)
					{
						for (uint32_t j = 0; j < 4; j++)
						{
							uint32_t cur_byte = sym_codec.get_bits(8);
							prev_bytes[j] = static_cast<uint8_t>(cur_byte);

							for (uint32_t k = 0; k < 4; k++)
								m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
						}
						m_local_selectors[i].init_flags();
						continue;
					}

					for (uint32_t j = 0; j < 4; j++)
					{
						int delta_byte = sym_codec.decode_huffman(delta_selector_pal_model);

						uint32_t cur_byte = delta_byte ^ prev_bytes[j];
						prev_bytes[j] = static_cast<uint8_t>(cur_byte);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}
					m_local_selectors[i].init_flags();
				}
			}
		}

		sym_codec.stop();

		return true;
	}